

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint64_t __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::
getIdAndFillBrand<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1>
          (BrandedDecl *this,Type *initBrand)

{
  bool bVar1;
  BrandScope *this_00;
  Type *initBrand_00;
  ResolvedDecl *pRVar2;
  Fault local_20;
  Fault f;
  Type *initBrand_local;
  BrandedDecl *this_local;
  
  f.exception = (Exception *)initBrand;
  bVar1 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x38f,FAILED,"body.is<Resolver::ResolvedDecl>()","");
    kj::_::Debug::Fault::fatal(&local_20);
  }
  this_00 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->(&this->brand);
  initBrand_00 = kj::
                 fwd<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1>
                           ((NoInfer<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_node_translator_c__:2390:9)>
                             *)f.exception);
  BrandScope::
  compile<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1>
            (this_00,initBrand_00);
  pRVar2 = kj::
           OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
           ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
  return pRVar2->id;
}

Assistant:

uint64_t NodeTranslator::BrandedDecl::getIdAndFillBrand(InitBrandFunc&& initBrand) {
  KJ_REQUIRE(body.is<Resolver::ResolvedDecl>());

  brand->compile(kj::fwd<InitBrandFunc>(initBrand));
  return body.get<Resolver::ResolvedDecl>().id;
}